

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

void __thiscall tokenizer::read_current_file(tokenizer *this)

{
  ifstream *piVar1;
  string *this_00;
  byte __c;
  char cVar2;
  int iVar3;
  istream *piVar4;
  uint uVar5;
  byte *pbVar6;
  string line;
  byte *local_50;
  undefined8 local_48;
  byte local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  this->line_number = 0;
  piVar1 = &this->current_stream;
  this_00 = &this->current_word;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar1 + -0x18) + (char)piVar1);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)piVar1,(string *)&local_50,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (this_00,0,(this->current_word)._M_string_length,"eof",3);
      add_token_to_stream(this,eof);
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      return;
    }
    this->line_number = this->line_number + 1;
    this->position_number = 1;
    this->line_char = (char *)local_50;
    pbVar6 = local_50;
    while (__c = *pbVar6, __c != 0) {
      if (this->inComment == true) {
LAB_0010d1cc:
        continue_to_read_comment(this);
        goto LAB_0010d1f0;
      }
      if ((__c == 0x20) || (__c == 9)) {
        this->line_char = (char *)(pbVar6 + 1);
        goto LAB_0010d1ed;
      }
      iVar3 = isalpha((int)(char)__c);
      if ((__c == 0x5f) || (iVar3 != 0)) {
        read_identifier(this);
        goto LAB_0010d1f0;
      }
      if ((int)(char)__c - 0x30U < 10) {
LAB_0010d213:
        read_number(this);
        goto LAB_0010d1f0;
      }
      if (__c == 0x2f) {
        if (pbVar6[1] == 0x2f) break;
        if (pbVar6[1] == 0x2a) {
          this->line_char = (char *)(pbVar6 + 2);
          uVar5 = this->position_number + 2;
          this->position_number = uVar5;
          this->last_line_number = this->line_number;
          this->last_position_number = uVar5;
          this->inComment = true;
          goto LAB_0010d1cc;
        }
      }
      if (0x7a < __c) {
        if (__c == 0x7b) {
LAB_0010d407:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,__c);
          add_token_to_stream(this,left_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,(this->current_word)._M_string_length,"",0);
        }
        else {
          if (__c == 0x7c) goto switchD_0010d28c_caseD_0;
          if (__c != 0x7d) goto switchD_0010d28c_caseD_2;
LAB_0010d2b5:
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,__c);
          add_token_to_stream(this,right_curly_bracket);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this_00,0,(this->current_word)._M_string_length,"",0);
        }
        goto LAB_0010d438;
      }
      switch(__c - 0x21) {
      case 0:
      case 4:
      case 5:
      case 9:
      case 10:
      case 0xe:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        goto switchD_0010d28c_caseD_0;
      case 1:
switchD_0010d28c_caseD_1:
        this->line_char = (char *)(pbVar6 + 1);
        read_string(this);
        goto LAB_0010d1f0;
      default:
switchD_0010d28c_caseD_2:
        this->last_line_number = this->line_number;
        this->last_position_number = this->position_number;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,*this->line_char);
          this->line_char = this->line_char + 1;
          this->position_number = this->position_number + 1;
        } while( true );
      case 7:
switchD_0010d28c_caseD_7:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,__c);
        add_token_to_stream(this,left_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
        break;
      case 8:
switchD_0010d28c_caseD_8:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,__c);
        add_token_to_stream(this,right_round_bracket);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
        break;
      case 0xc:
        if ((int)(char)pbVar6[1] - 0x30U < 10) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,'-');
          this->line_char = this->line_char + 1;
          this->position_number = this->position_number + 1;
          goto LAB_0010d213;
        }
        if (__c < 0x7b) {
          switch(__c - 0x21) {
          case 0:
          case 4:
          case 5:
          case 9:
          case 10:
          case 0xc:
          case 0xe:
          case 0x1b:
          case 0x1c:
          case 0x1d:
            goto switchD_0010d28c_caseD_0;
          case 1:
            goto switchD_0010d28c_caseD_1;
          default:
            goto switchD_0010d28c_caseD_2;
          case 7:
            goto switchD_0010d28c_caseD_7;
          case 8:
            goto switchD_0010d28c_caseD_8;
          case 0x1a:
            goto switchD_0010d28c_caseD_1a;
          }
        }
        if (__c == 0x7b) goto LAB_0010d407;
        if (__c == 0x7d) goto LAB_0010d2b5;
        if (__c != 0x7c) goto switchD_0010d28c_caseD_2;
        goto switchD_0010d28c_caseD_0;
      case 0x1a:
switchD_0010d28c_caseD_1a:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,__c);
        add_token_to_stream(this,semicolon);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,(this->current_word)._M_string_length,"",0);
      }
LAB_0010d438:
      this->line_char = this->line_char + 1;
LAB_0010d1ed:
      this->position_number = this->position_number + 1;
LAB_0010d1f0:
      pbVar6 = (byte *)this->line_char;
    }
  } while( true );
switchD_0010d28c_caseD_0:
  read_symbol(this);
  goto LAB_0010d1f0;
}

Assistant:

void tokenizer::read_current_file() {
    string line;

    line_number = 0;

    while(getline(current_stream, line)) {

        line_number++;
        position_number = 1;

        line_char = line.c_str();

        while(*line_char != '\0') {
            if(inComment) {
                this->continue_to_read_comment();
            }
            else if(*line_char == ' ' || *line_char == '\t') {
                this->advance_to_next_character();
            }
            else if(isalpha(*line_char) || *line_char == '_') {
                this->read_identifier();
            }
            else if(isdigit(*line_char)) {
                this->read_number();
            }
            else if(*line_char == '/' && *(line_char + 1) == '/') {
                break;
            }
            else if(*line_char == '/' && *(line_char + 1) == '*') {
                this->read_comment();
            }
            else if(*line_char == '-' && isdigit(*(line_char + 1))) {
                current_word += '-';
                this->advance_to_next_character();
                this->read_number();
            }
            else if(*line_char == '+' || *line_char == '-' || *line_char == '*'
            || *line_char == '/' || *line_char == '=' || *line_char == '&'
            || *line_char == '|' || *line_char == '<' || *line_char == '>'
            || *line_char == '!' || *line_char == '%') {
                this->read_symbol();
            }
            else if(*line_char == '"') {
                line_char++;
                this->read_string();
            }
            else if(*line_char == '{') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '}') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_curly_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == '(') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::left_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ')') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::right_round_bracket);
                current_word = "";
                this->advance_to_next_character();
            }
            else if(*line_char == ';') {
                current_word += *line_char;
                this->add_token_to_stream(Token_Type::semicolon);
                current_word = "";
                this->advance_to_next_character();
            }
            else {
                this->read_invalid_token();
            }
        }
    }
    current_word = "eof";
    this->add_token_to_stream(Token_Type::eof);
}